

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  pointer pMVar2;
  ostream *poVar3;
  ColourImpl *pCVar4;
  undefined4 in_register_00000034;
  char local_41;
  pluralise local_40;
  
  pMVar1 = (this->itMessage)._M_current;
  pMVar2 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar2) {
    poVar3 = this->stream;
    pCVar4 = this->colourImpl;
    (*pCVar4->_vptr_ColourImpl[2])(pCVar4,CONCAT44(in_register_00000034,colour));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," with ",6);
    local_40.m_count = ((long)pMVar2 - (long)pMVar1 >> 3) * -0x71c71c71c71c71c7;
    local_40.m_label.m_start = "message";
    local_40.m_label.m_size = 7;
    operator<<(poVar3,&local_40);
    local_41 = ':';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_41,1);
    (*pCVar4->_vptr_ColourImpl[2])(pCVar4,0);
    pMVar1 = (this->itMessage)._M_current;
    while (pMVar1 != pMVar2) {
      if ((this->printInfoMessages == false) && (pMVar1->type == Info)) {
        (this->itMessage)._M_current = pMVar1 + 1;
      }
      else {
        printMessage(this);
        if ((this->itMessage)._M_current != pMVar2) {
          poVar3 = this->stream;
          pCVar4 = this->colourImpl;
          (*pCVar4->_vptr_ColourImpl[2])(pCVar4,0x17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," and",4);
          (*pCVar4->_vptr_ColourImpl[2])(pCVar4,0);
        }
      }
      pMVar1 = (this->itMessage)._M_current;
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = compactDimColour) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(itEnd - itMessage);

        stream << colourImpl->guardColour( colour ) << " with "
               << pluralise( N, "message"_sr ) << ':';

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    stream << colourImpl->guardColour(compactDimColour) << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }